

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall higan::EventLoop::HandleTimeoutEvent(EventLoop *this)

{
  pointer pTVar1;
  pointer pTVar2;
  Timer *pTVar3;
  LogLevel LVar4;
  string *psVar5;
  _Any_data *p_Var6;
  undefined8 uVar7;
  Timer *this_00;
  pointer this_01;
  Logger local_348;
  Fmt local_130;
  
  pTVar1 = (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_01 = pTVar1;
  if (pTVar2 != pTVar1) {
    do {
      Timer::~Timer(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pTVar2);
    (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar1;
  }
  TimerManager::GetTimeoutTimer(&this->timer_manager_,&this->timeout_timers_);
  this_00 = (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pTVar3) {
    do {
      LVar4 = Logger::GetLogLevel();
      if ((int)LVar4 < 2) {
        Logger::Logger(&local_348,INFO,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoop.cpp"
                       ,0x54,"HandleTimeoutEvent");
        psVar5 = Timer::GetName_abi_cxx11_(this_00);
        Fmt::Fmt(&local_130,"Timer: %s timeout",(psVar5->_M_dataplus)._M_p);
        Logger::operator<<(&local_348,&local_130);
        Logger::~Logger(&local_348);
      }
      p_Var6 = (_Any_data *)Timer::GetTimerCallback(this_00);
      if (*(long *)(p_Var6 + 1) == 0) {
        uVar7 = std::__throw_bad_function_call();
        Logger::~Logger(&local_348);
        _Unwind_Resume(uVar7);
      }
      (**(code **)(p_Var6->_M_pod_data + 0x18))(p_Var6,this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pTVar3);
  }
  return;
}

Assistant:

void EventLoop::HandleTimeoutEvent()
{
	timeout_timers_.clear();
	timer_manager_.GetTimeoutTimer(&timeout_timers_);

	for (const Timer& timer : timeout_timers_)
	{
		LOG_INFO << higan::Fmt("Timer: %s timeout", timer.GetName().c_str());
		timer.GetTimerCallback()(timer);
	}
}